

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  uint8_t *array;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  char *last_name;
  long lVar7;
  size_t __size;
  char *first_name;
  char student_prompt [128];
  char local_b8 [136];
  
  iVar2 = query_int("How many students to process? ",10,100);
  __size = (size_t)iVar2;
  array = (uint8_t *)malloc(__size);
  pcVar3 = (char *)malloc(__size);
  pcVar4 = (char *)malloc(__size);
  if (iVar2 != 0) {
    lVar7 = 1;
    last_name = pcVar4;
    first_name = pcVar3;
    do {
      sprintf(local_b8,"Please enter student %zu\'s mid-term mark: ",lVar7);
      iVar2 = query_int(local_b8,0,0x14);
      array[lVar7 + -1] = (uint8_t)iVar2;
      query_initials(first_name,last_name);
      last_name = last_name + 1;
      first_name = first_name + 1;
      lVar1 = lVar7 + 1;
      lVar7 = lVar7 + 1;
    } while (lVar1 - __size != 1);
  }
  sVar5 = find_minimum(array,__size);
  sVar6 = find_maximum(array,__size);
  putchar(10);
  printf("The smallest note is %u.\n",(ulong)array[sVar5]);
  printf("The highest note is %u, it was obtained by %c%c.\n",(ulong)array[sVar6],
         (ulong)(uint)(int)pcVar3[sVar6],(ulong)(uint)(int)pcVar4[sVar6]);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  // Ask how many students will be processed
  const size_t n_students = (size_t)query_int("How many students to process? ", 10, 100);

  uint8_t* notes = (uint8_t*)malloc(sizeof(uint8_t) * n_students);
  char* first_name_initials = (char*)malloc(sizeof(char) * n_students);
  char* last_name_initials = (char*)malloc(sizeof(char) * n_students);

  // Prompt for each student
  for (size_t n = 0; n < n_students; n++) {
    char student_prompt[128];
    sprintf(student_prompt, "Please enter student %zu's mid-term mark: ", n + 1);
    notes[n] = (uint8_t)query_int(student_prompt, 0, 20);
    query_initials(&first_name_initials[n], &last_name_initials[n]);
  }

  // Get minimum and maximum indexes
  const size_t min_index = find_minimum(notes, n_students);
  const size_t max_index = find_maximum(notes, n_students);

  printf("\n");

  printf("The smallest note is %" PRIu8 ".\n", notes[min_index]);
  printf("The highest note is %" PRIu8 ", it was obtained by %c%c.\n", notes[max_index], first_name_initials[max_index], last_name_initials[max_index]);

  return 0;
}